

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetamlevlat.cpp
# Opt level: O0

bool __thiscall
EnvironmentNAVXYTHETAMLEVLAT::IsObstacle(EnvironmentNAVXYTHETAMLEVLAT *this,int X,int Y)

{
  bool bVar1;
  int in_EDX;
  int in_ESI;
  EnvironmentNAVXYTHETALATTICE *in_RDI;
  int levelind;
  int local_1c;
  bool local_1;
  
  bVar1 = EnvironmentNAVXYTHETALATTICE::IsObstacle(in_RDI,in_ESI,in_EDX);
  if (bVar1) {
    local_1 = true;
  }
  else {
    for (local_1c = 0; local_1c < *(int *)&in_RDI[1].EnvNAVXYTHETALATCfg.Grid2D;
        local_1c = local_1c + 1) {
      if ((in_RDI->EnvNAVXYTHETALATCfg).obsthresh <=
          *(byte *)(*(long *)((long)in_RDI[1].EnvNAVXYTHETALATCfg.ThetaDirs.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage[local_1c] +
                             (long)in_ESI * 8) + (long)in_EDX)) {
        return true;
      }
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool EnvironmentNAVXYTHETAMLEVLAT::IsObstacle(int X, int Y)
{
    int levelind;

    if (EnvironmentNAVXYTHETALAT::IsObstacle(X, Y)) return true;

    //iterate through the additional levels
    for (levelind = 0; levelind < numofadditionalzlevs; levelind++) {
        if (AddLevelGrid2D[levelind][X][Y] >= EnvNAVXYTHETALATCfg.obsthresh) return true;
    }
    //otherwise the cell is obstacle-free at all cells
    return false;
}